

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O0

bool __thiscall
Assimp::LWSImporter::CanRead(LWSImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  long lVar2;
  undefined4 local_68;
  undefined4 local_64;
  uint32_t tokens [2];
  undefined1 local_50 [8];
  string extension;
  bool checkSig_local;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  LWSImporter *this_local;
  
  extension.field_2._M_local_buf[0xf] = checkSig;
  BaseImporter::GetExtension((string *)local_50,pFile);
  bVar1 = std::operator==((string *)local_50,"lws");
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,"mot");
    if (!bVar1) {
      lVar2 = std::__cxx11::string::length();
      if ((lVar2 == 0) || ((extension.field_2._M_local_buf[0xf] & 1U) != 0)) {
        local_68 = 0x4c575343;
        local_64 = 0x4c574d4f;
        this_local._7_1_ = BaseImporter::CheckMagicToken(pIOHandler,pFile,&local_68,2,0,4);
      }
      else {
        this_local._7_1_ = false;
      }
      goto LAB_0067a01a;
    }
  }
  this_local._7_1_ = true;
LAB_0067a01a:
  tokens[0] = 1;
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool LWSImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler,bool checkSig) const
{
    const std::string extension = GetExtension(pFile);
    if (extension == "lws" || extension == "mot")
        return true;

    // if check for extension is not enough, check for the magic tokens LWSC and LWMO
    if (!extension.length() || checkSig) {
        uint32_t tokens[2];
        tokens[0] = AI_MAKE_MAGIC("LWSC");
        tokens[1] = AI_MAKE_MAGIC("LWMO");
        return CheckMagicToken(pIOHandler,pFile,tokens,2);
    }
    return false;
}